

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall
pbrt::PMJ02BNSampler::PMJ02BNSampler(PMJ02BNSampler *this,int samplesPerPixel,Allocator alloc)

{
  bool bVar1;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_00000010;
  int *in_stack_00000120;
  int in_stack_0000012c;
  Allocator in_stack_00000130;
  Point2<int> *in_stack_ffffffffffffffe0;
  
  Point2<int>::Point2(in_stack_ffffffffffffffe0);
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x10) = in_ESI;
  bVar1 = IsPowerOf4<int>(0);
  if (!bVar1) {
    Warning<>((char *)CONCAT44(samplesPerPixel,in_stack_00000010));
  }
  pvVar2 = GetSortedPMJ02BNPixelSamples(in_stack_0000012c,in_stack_00000130,in_stack_00000120);
  *(vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> **)
   (in_RDI + 0x18) = pvVar2;
  return;
}

Assistant:

PMJ02BNSampler::PMJ02BNSampler(int samplesPerPixel, Allocator alloc)
    : samplesPerPixel(samplesPerPixel) {
    if (!IsPowerOf4(samplesPerPixel))
        Warning("PMJ02BNSampler results are best with power-of-4 samples per "
                "pixel (1, 4, 16, 64, ...)");
    pixelSamples = GetSortedPMJ02BNPixelSamples(samplesPerPixel, alloc, &pixelTileSize);
}